

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall sglr::GLContext::scissor(GLContext *this,int x,int y,int width,int height)

{
  code *pcVar1;
  int iVar2;
  MessageBuilder *pMVar3;
  undefined4 extraout_var;
  int *piVar4;
  undefined1 local_1c4 [8];
  IVec2 offset;
  MessageBuilder local_1b0;
  Vector<int,_4> local_30;
  int local_20;
  int local_1c;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  GLContext *this_local;
  
  local_20 = height;
  local_1c = width;
  height_local = y;
  width_local = x;
  _y_local = this;
  tcu::Vector<int,_4>::Vector(&local_30,x,y,width,height);
  *(undefined8 *)(this->m_curScissor).m_data = local_30.m_data._0_8_;
  *(undefined8 *)((this->m_curScissor).m_data + 2) = local_30.m_data._8_8_;
  if ((this->m_logFlags & 1) != 0) {
    tcu::TestLog::operator<<(&local_1b0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [11])"glScissor(");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&width_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x12ed2ef);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&height_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x12ed2ef);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x12ed2ef);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_20);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x1277a05);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  getDrawOffset((GLContext *)local_1c4);
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x1290);
  piVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_1c4);
  iVar2 = *piVar4 + width_local;
  piVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_1c4);
  (*pcVar1)(iVar2,*piVar4 + height_local,local_1c,local_20);
  return;
}

Assistant:

void GLContext::scissor (int x, int y, int width, int height)
{
	m_curScissor = tcu::IVec4(x, y, width, height);

	// \note For clarity don't add the offset to log
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glScissor(" << x << ", " << y << ", " << width << ", " << height << ");" << TestLog::EndMessage;

	tcu::IVec2 offset = getDrawOffset();
	m_context.getFunctions().scissor(offset.x()+x, offset.y()+y, width, height);
}